

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuconnection.cpp
# Opt level: O2

bool __thiscall QDBusMenuConnection::registerTrayIcon(QDBusMenuConnection *this,QDBusTrayIcon *item)

{
  char cVar1;
  bool bVar2;
  QDebug *pQVar3;
  QString *item_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  undefined4 local_50;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined4 local_3c;
  char *local_38;
  QDebug local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusConnection::QDBusConnection((QDBusConnection *)&local_50,(QDBusConnection *)(this + 0x28));
  item_00 = &StatusNotifierItemPath;
  cVar1 = QDBusConnection::registerObject
                    ((QDBusConnection *)&local_50,&StatusNotifierItemPath,item,1);
  QDBusConnection::~QDBusConnection((QDBusConnection *)&local_50);
  if (cVar1 == '\0') {
    unregisterTrayIcon(this,item);
    local_50 = 2;
    local_3c = 0;
    local_4c = 0;
    uStack_44 = 0;
    local_38 = "default";
    QMessageLogger::warning();
    pQVar3 = QDebug::operator<<(&local_30,"failed to register");
    local_68.d = (item->m_instanceId).d.d;
    local_68.ptr = (item->m_instanceId).d.ptr;
    local_68.size = (item->m_instanceId).d.size;
    if (local_68.d != (Data *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar3 = QDebug::operator<<(pQVar3,(QString *)&local_68);
    QDebug::operator<<(pQVar3,&StatusNotifierItemPath);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QDebug::~QDebug(&local_30);
    bVar2 = false;
  }
  else {
    if (item->m_menu != (QDBusPlatformMenu *)0x0) {
      registerTrayIconMenu(this,item);
      item_00 = (QString *)item;
    }
    bVar2 = registerTrayIconWithWatcher(this,(QDBusTrayIcon *)item_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QDBusMenuConnection::registerTrayIcon(QDBusTrayIcon *item)
{
    bool success = connection().registerObject(StatusNotifierItemPath, item);
    if (!success) {
        unregisterTrayIcon(item);
        qWarning() << "failed to register" << item->instanceId() << StatusNotifierItemPath;
        return false;
    }

    if (item->menu())
        registerTrayIconMenu(item);

    return registerTrayIconWithWatcher(item);
}